

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

void __thiscall HighsCutGeneration::flipComplementation(HighsCutGeneration *this,HighsInt index)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  double in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x80),
                      (long)in_ESI);
  vVar3 = '\x01' - *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x80),
                      (long)in_ESI);
  *pvVar4 = vVar3;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)in_ESI);
  dVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)in_ESI);
  dVar2 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)in_ESI);
  *pvVar5 = dVar1 - dVar2;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)in_ESI);
  HighsCDouble::operator-=
            ((HighsCDouble *)CONCAT17(vVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  *(ulong *)(*(long *)(in_RDI + 0xc0) + (long)in_ESI * 8) =
       *(ulong *)(*(long *)(in_RDI + 0xc0) + (long)in_ESI * 8) ^ 0x8000000000000000;
  return;
}

Assistant:

void HighsCutGeneration::flipComplementation(HighsInt index) {
  // only variables with finite upper bounds can be complemented
  assert(upper[index] != kHighsInf);

  // flip complementation
  complementation[index] = 1 - complementation[index];
  solval[index] = upper[index] - solval[index];
  rhs -= upper[index] * vals[index];
  vals[index] = -vals[index];
}